

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O2

ktx_error_code_e
ktxTexture2_transcodeLzEtc1s
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  bool is_video;
  ktx_uint32_t kVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  uint32_t alpha_length;
  ktxTexture2_private *pkVar4;
  ushort *puVar5;
  ktxTexture2_private *pkVar6;
  ktx_uint8_t *pkVar7;
  bool bVar8;
  ktx_uint32_t kVar9;
  undefined4 *puVar10;
  ulong uVar11;
  ktx_uint64_t kVar12;
  ktx_size_t kVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ktx_error_code_e kVar18;
  int iVar19;
  size_type __new_size;
  uint uVar20;
  uint uVar21;
  ktx_uint64_t kVar22;
  ulong uVar23;
  uint32_t orig_width;
  uint32_t *puVar24;
  uint32_t orig_height;
  float fVar25;
  ulong local_418;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  basisu_lowlevel_etc1s_transcoder bit;
  
  if (This->supercompressionScheme != KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme == KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x1d3,
                  "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  pkVar4 = This->_private;
  puVar5 = (ushort *)pkVar4->_supercompressionGlobalData;
  if (((*(int *)(puVar5 + 2) == 0) || (*(int *)(puVar5 + 4) == 0)) || (*(int *)(puVar5 + 6) == 0)) {
    basisu::debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
  }
  else {
    pkVar6 = prototype->_private;
    uVar17 = (ulong)This->numLevels;
    puVar10 = (undefined4 *)operator_new__((ulong)(This->numLevels + 1) << 2);
    kVar9 = This->numFaces;
    kVar1 = This->numLayers;
    *puVar10 = 0;
    iVar19 = 0;
    for (uVar11 = 1; uVar11 <= uVar17; uVar11 = uVar11 + 1) {
      uVar20 = This->baseDepth >> ((char)uVar11 - 1U & 0x1f);
      iVar19 = iVar19 + (uVar20 + (uVar20 == 0)) * kVar9 * kVar1;
      puVar10[uVar11] = iVar19;
    }
    if ((ulong)*(uint *)(puVar5 + 6) +
        (ulong)*(uint *)(puVar5 + 4) + (ulong)*(uint *)(puVar5 + 2) +
        (ulong)(uint)puVar10[uVar17] * 0x14 + 0x14 <= pkVar4->_sgdByteLength) {
      basist::basisu_lowlevel_etc1s_transcoder::basisu_lowlevel_etc1s_transcoder(&bit);
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (This->isVideo == true) {
        __new_size = (size_type)This->numFaces;
      }
      else {
        __new_size = 1;
      }
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::resize(&xcoderStates,__new_size);
      basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
                (&bit,(uint)*puVar5,(uint8_t *)(puVar5 + (ulong)(uint)puVar10[uVar17] * 10 + 10),
                 *(uint *)(puVar5 + 2),(uint)puVar5[1],
                 (uint8_t *)
                 ((ulong)*(uint *)(puVar5 + 2) +
                 (long)(puVar5 + (ulong)(uint)puVar10[uVar17] * 10 + 10)),*(uint32_t *)(puVar5 + 4))
      ;
      basist::basisu_lowlevel_etc1s_transcoder::decode_tables
                (&bit,(uint8_t *)
                      ((long)puVar5 +
                      (ulong)(uint)puVar10[uVar17] * 0x14 +
                      (ulong)*(uint *)(puVar5 + 4) + (ulong)*(uint *)(puVar5 + 2) + 0x14),
                 *(uint32_t *)(puVar5 + 6));
      is_video = This->isVideo;
      pkVar7 = prototype->pData;
      uVar11 = prototype->dataSize;
      uVar17 = (ulong)((prototype->_protected->_formatSize).blockSizeInBits >> 3);
      kVar9 = This->numLevels;
      local_418 = 0;
      do {
        kVar9 = kVar9 - 1;
        if ((int)kVar9 < 0) {
          kVar18 = KTX_SUCCESS;
LAB_00118f7f:
          operator_delete__(puVar10);
LAB_00118f87:
          std::
          vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
          ::~vector(&xcoderStates);
          basist::basisu_lowlevel_etc1s_transcoder::~basisu_lowlevel_etc1s_transcoder(&bit);
          return kVar18;
        }
        kVar12 = ktxTexture2_levelDataOffset(This,kVar9);
        bVar14 = (byte)kVar9;
        uVar20 = This->baseWidth >> (bVar14 & 0x1f);
        orig_width = uVar20 + (uVar20 == 0);
        uVar20 = This->baseHeight >> (bVar14 & 0x1f);
        orig_height = uVar20 + (uVar20 == 0);
        uVar20 = This->baseDepth;
        kVar1 = This->numFaces;
        kVar2 = This->numLayers;
        uVar15 = kVar9 & 0x7fffffff;
        uVar3 = puVar10[uVar15];
        uVar23 = (ulong)uVar3;
        kVar13 = ktxTexture2_GetImageSize(prototype,kVar9);
        uVar20 = uVar20 >> (bVar14 & 0x1f);
        kVar22 = 0;
        puVar24 = (uint32_t *)(puVar5 + uVar23 * 10 + 0x12);
        uVar16 = 0;
        for (; uVar23 < kVar1 * kVar2 * (uVar20 + (uVar20 == 0)) + uVar3; uVar23 = uVar23 + 1) {
          uVar21 = 0;
          if (((long)xcoderStates.
                     super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)xcoderStates.
                    super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x220 != (ulong)(uVar16 + 1)) {
            uVar21 = uVar16 + 1;
          }
          if (alphaContent == eNone) {
            alpha_length = *puVar24;
          }
          else if ((puVar24[-1] == 0) || (alpha_length = *puVar24, alpha_length == 0)) {
            kVar18 = KTX_FILE_DATA_ERROR;
            goto LAB_00118f87;
          }
          bVar8 = basist::basisu_lowlevel_etc1s_transcoder::transcode_image
                            (&bit,outputFormat,pkVar7 + kVar22 + local_418,
                             (int)(uVar11 / uVar17) - (int)(local_418 / uVar17),This->pData,
                             (uint32_t)This->dataSize,orig_width + 3 >> 2,orig_height + 3 >> 2,
                             orig_width,orig_height,kVar9,puVar24[-3] + (int)kVar12,puVar24[-2],
                             puVar24[-1] + (int)kVar12,alpha_length,transcodeFlags,
                             alphaContent != eNone,is_video,0,
                             xcoderStates.
                             super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar16,0);
          if (!bVar8) {
            kVar18 = KTX_TRANSCODE_FAILED;
            goto LAB_00118f7f;
          }
          kVar22 = kVar22 + kVar13;
          puVar24 = puVar24 + 5;
          uVar16 = uVar21;
        }
        pkVar6->_levelIndex[uVar15].byteOffset = local_418;
        pkVar6->_levelIndex[uVar15].byteLength = kVar22;
        pkVar6->_levelIndex[uVar15].uncompressedByteLength = kVar22;
        uVar20 = pkVar6->_requiredLevelAlignment;
        fVar25 = ceilf((float)(local_418 + kVar22) / (float)uVar20);
        local_418 = (long)(fVar25 * (float)uVar20) & 0xffffffff;
      } while( true );
    }
    operator_delete__(puVar10);
  }
  return KTX_FILE_DATA_ERROR;
}

Assistant:

KTX_error_code
ktxTexture2_transcodeLzEtc1s(ktxTexture2* This,
                             alpha_content_e alphaContent,
                             ktxTexture2* prototype,
                             ktx_transcode_fmt_e outputFormat,
                             ktx_transcode_flags transcodeFlags)
{
    DECLARE_PRIVATE(priv, This);
    DECLARE_PRIVATE(protoPriv, prototype);
    KTX_error_code result = KTX_SUCCESS;

    assert(This->supercompressionScheme == KTX_SS_BASIS_LZ);

    uint8_t* bgd = priv._supercompressionGlobalData;
    ktxBasisLzGlobalHeader& bgdh = *reinterpret_cast<ktxBasisLzGlobalHeader*>(bgd);
    if (!(bgdh.endpointsByteLength && bgdh.selectorsByteLength && bgdh.tablesByteLength)) {
        debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
        return KTX_FILE_DATA_ERROR;
    }

    // Compute some helpful numbers.
    //
    // firstImages contains the indices of the first images for each level to
    // ease finding the correct slice description when iterating from smallest
    // level to largest or when randomly accessing them (t.b.c). The last array
    // entry contains the total number of images, for calculating the offsets
    // of the endpoints, etc.
    uint32_t* firstImages = new uint32_t[This->numLevels+1];

    // Temporary invariant value
    uint32_t layersFaces = This->numLayers * This->numFaces;
    firstImages[0] = 0;
    for (uint32_t level = 1; level <= This->numLevels; level++) {
        // NOTA BENE: numFaces * depth is only reasonable because they can't
        // both be > 1. I.e there are no 3d cubemaps.
        firstImages[level] = firstImages[level - 1]
                           + layersFaces * MAX(This->baseDepth >> (level - 1), 1);
    }
    uint32_t& imageCount = firstImages[This->numLevels];

    if (BGD_TABLES_ADDR(0, bgdh, imageCount) + bgdh.tablesByteLength > priv._sgdByteLength) {
        // Compiler will not allow `goto cleanup;` because "jump bypasses variable initialization."
        // The static initializations below this and before the loop are presumably the issue
        // as the compiler is,presumably, inserting code to destruct those at the end of the
        // function.
        delete[] firstImages;
        return KTX_FILE_DATA_ERROR;
    }
    // FIXME: Do more validation.

    // Prepare low-level transcoder for transcoding slices.
    basist::basisu_lowlevel_etc1s_transcoder bit;

    // basisu_transcoder_state is used to find the previous frame when
    // decoding a video P-Frame. It tracks the previous frame for each mip
    // level. For cube map array textures we need to find the previous frame
    // for each face so we a state per face. Although providing this is only
    // needed for video, it is easier to always pass our own.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    bit.decode_palettes(bgdh.endpointCount, BGD_ENDPOINTS_ADDR(bgd, imageCount),
                        bgdh.endpointsByteLength,
                        bgdh.selectorCount, BGD_SELECTORS_ADDR(bgd, bgdh, imageCount),
                        bgdh.selectorsByteLength);

    bit.decode_tables(BGD_TABLES_ADDR(bgd, bgdh, imageCount),
                      bgdh.tablesByteLength);

    // Find matching VkFormat and calculate output sizes.

    const bool isVideo = This->isVideo;

    ktx_uint8_t* pXcodedData = prototype->pData;
    // Inconveniently, the output buffer size parameter of transcode_image
    // has to be in pixels for uncompressed output and in blocks for
    // compressed output. The only reason for humouring the API is so
    // its buffer size tests provide a real check. An alternative is to
    // always provide the size in bytes which will always pass.
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    ktxLevelIndexEntry* protoLevelIndex;
    uint64_t levelOffsetWrite;
    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(bgd);

    // Finally we're ready to transcode the slices.

    // FIXME: Iframe flag needs to be queryable by the application. In Basis
    // the app can query file_info and image_info from the transcoder which
    // returns a structure with lots of info about the image.

    protoLevelIndex = protoPriv._levelIndex;
    levelOffsetWrite = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        uint64_t levelOffset = ktxTexture2_levelDataOffset(This, level);
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // ETC1S texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t depth = MAX(1, This->baseDepth >> level);
        //uint32_t faceSlices = This->numFaces == 1 ? depth : This->numFaces;
        uint32_t faceSlices = This->numFaces * depth;
        uint32_t numImages = This->numLayers * faceSlices;
        uint32_t image = firstImages[level];
        uint32_t endImage = image + numImages;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        uint32_t stateIndex = 0;

        levelSizeOut = 0;
        // FIXME: Figure out a way to get the size out of the transcoder.
        levelImageSizeOut = ktxTexture2_GetImageSize(prototype, level);
        for (; image < endImage; image++) {
            const ktxBasisLzEtc1sImageDesc& imageDesc = imageDescs[image];

            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // We have face0 [face1 ...] within each layer. Use `stateIndex`
            // rather than a double loop of layers and faceSlices as this
            // works for 3d texture and non-array cube maps as well as
            // cube map arrays without special casing.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            if (alphaContent != eNone)
            {
                // The slice descriptions should have alpha information.
                if (imageDesc.alphaSliceByteOffset == 0
                    || imageDesc.alphaSliceByteLength == 0)
                    return KTX_FILE_DATA_ERROR;
            }

            bool status;
            status = bit.transcode_image(
                      (transcoder_texture_format)outputFormat,
                      pXcodedData + writeOffset,
                      (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                      This->pData,
                      (uint32_t)This->dataSize,
                      levelBlocksX,
                      levelBlocksY,
                      levelWidth,
                      levelHeight,
                      level,
                      (uint32_t)(levelOffset + imageDesc.rgbSliceByteOffset),
                      imageDesc.rgbSliceByteLength,
                      (uint32_t)(levelOffset + imageDesc.alphaSliceByteOffset),
                      imageDesc.alphaSliceByteLength,
                      transcodeFlags,
                      alphaContent != eNone,
                      isVideo,
                      // Our P-Frame flag is in the same bit as
                      // cSliceDescFlagsFrameIsIFrame. We have to
                      // invert it to make it an I-Frame flag.
                      //
                      // API currently doesn't have any way to pass
                      // the I-Frame flag.
                      //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                      0, // output_row_pitch_in_blocks_or_pixels
                      &xcoderState,
                      0  // output_rows_in_pixels
                      );
            if (!status) {
                result = KTX_TRANSCODE_FAILED;
                goto cleanup;
            }

            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
        } // end images loop
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
        assert(levelOffsetWrite == writeOffset);
        // In case of transcoding to uncompressed.
        levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                     levelOffsetWrite);
    } // level loop

    result = KTX_SUCCESS;

cleanup:
    delete[] firstImages;
    return result;
}